

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void final_check(artifact *art,object *obj)

{
  int16_t iVar1;
  _Bool _Var2;
  bitflag *flags_00;
  int16_t *piVar3;
  element_info *local_50;
  int local_34;
  wchar_t i;
  element_info *el_info;
  int16_t *modifiers;
  bitflag *flags;
  object *obj_local;
  artifact *art_local;
  
  if (art == (artifact *)0x0) {
    flags_00 = obj->flags;
    piVar3 = obj->modifiers;
    local_50 = obj->el_info;
  }
  else {
    flags_00 = art->flags;
    piVar3 = art->modifiers;
    local_50 = art->el_info;
  }
  for (local_34 = 0; local_34 < 0x11; local_34 = local_34 + 1) {
    if ((local_34 < 5) && (piVar3[local_34] < 0)) {
      flag_off(flags_00,6,local_34 + 1);
    }
    if (local_34 != 9) {
      if (piVar3[local_34] < 7) {
        iVar1 = piVar3[local_34];
      }
      else {
        iVar1 = 6;
      }
      piVar3[local_34] = iVar1;
    }
  }
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    if (local_50[local_34].res_level < 100) {
      local_50[local_34].flags = local_50[local_34].flags | 2;
    }
  }
  if ((0 < piVar3[5]) && (_Var2 = flag_has_dbg(flags_00,6,0x1e,"flags","OF_AGGRAVATE"), _Var2)) {
    piVar3[5] = 0;
  }
  if ((0 < piVar3[0xd]) && (_Var2 = flag_has_dbg(flags_00,6,0x2b,"flags","OF_DARKNESS"), _Var2)) {
    piVar3[0xd] = 0;
  }
  remove_contradictory_activation(art,obj);
  return;
}

Assistant:

static void final_check(struct artifact *art, struct object *obj)
{
	bitflag *flags = art ? art->flags : obj->flags;
	int16_t *modifiers = art ? art->modifiers : obj->modifiers;
	struct element_info *el_info = art ? art->el_info : obj->el_info;
	int i;

	/* Limit modifiers, remove sustains if a stat modifier is negative */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if ((i < STAT_MAX) && (modifiers[i] < 0)) {
			of_off(flags, i + 1);
		}
		if (i != OBJ_MOD_SPEED) {
			modifiers[i] = MIN(modifiers[i], 6);
		}
	}

	/* Low resist means object is proof against that element */
	for (i = 0; i < ELEM_BASE_MAX; i++) {
		if (el_info[i].res_level < RES_LEVEL_BASE) {
			el_info[i].flags |= EL_INFO_IGNORE;
		}
	}

	/* Remove contradictory properties */
	if ((modifiers[OBJ_MOD_STEALTH] > 0) && of_has(flags, OF_AGGRAVATE)) {
		modifiers[OBJ_MOD_STEALTH] = 0;
	}
	if ((modifiers[OBJ_MOD_LIGHT] > 0) && of_has(flags, OF_DARKNESS)) {
		modifiers[OBJ_MOD_LIGHT] = 0;
	}
	remove_contradictory_activation(art, obj);
}